

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMDBitSet.cpp
# Opt level: O2

int __thiscall OpenMD::OpenMDBitSet::nthOnBit(OpenMDBitSet *this,unsigned_long n)

{
  int iVar1;
  int i;
  vector<int,_std::allocator<int>_> indices;
  
  indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  i = firstOnBit(this);
  for (; i != -1; i = nextOnBit(this,i)) {
    std::vector<int,_std::allocator<int>_>::push_back(&indices,&i);
  }
  if (n < (ulong)((long)indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2)) {
    iVar1 = indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[n];
  }
  else {
    iVar1 = -1;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&indices.super__Vector_base<int,_std::allocator<int>_>);
  return iVar1;
}

Assistant:

int OpenMDBitSet::nthOnBit(unsigned long int n) const {
    std::vector<int> indices;
    for (int i = firstOnBit(); i != -1; i = nextOnBit(i)) {
      indices.push_back(i);
    }

    if (n < indices.size()) return indices[n];
    return -1;
  }